

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpreadsheetMode.cpp
# Opt level: O1

void __thiscall KDReports::Test::testFontScaling(Test *this)

{
  Data *pDVar1;
  QRect *pQVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  AutoTableElement *pAVar9;
  reference pQVar10;
  QFont *pQVar11;
  longlong __tmp;
  QStandardItemModel *pQVar12;
  uint uVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  Report report;
  AutoTableElement tableElement;
  QArrayDataPointer<QRect> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QByteArrayView local_40;
  char *local_30;
  
  if (fontFound) {
    fillModel(this,2,0x19,false);
    KDReports::Report::Report((Report *)&local_b0,(QObject *)0x0);
    KDReports::Report::setReportMode((ReportMode)&local_b0);
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (QRect *)0x0;
    local_c8.size = 0;
    QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_98,"Noto Sans",9);
    QVar14.m_data = (storage_type *)local_98.d;
    QVar14.m_size = (qsizetype)&local_60;
    QString::fromLatin1(QVar14);
    qVar3 = local_c8.size;
    pQVar2 = local_c8.ptr;
    pDVar1 = local_c8.d;
    local_c8.d = (Data *)local_60.d;
    local_60.d = (Data *)pDVar1;
    local_c8.ptr = (QRect *)local_60.ptr;
    local_c8.size = local_60.size;
    local_60.ptr = (char16_t *)pQVar2;
    local_60.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QFont::QFont((QFont *)&local_78,(QString *)&local_c8,0x18,-1,false);
    KDReports::Report::setDefaultFont((QFont *)&local_b0);
    QFont::~QFont((QFont *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
    pQVar12 = &this->m_model;
    KDReports::AutoTableElement::AutoTableElement
              ((AutoTableElement *)&local_60,(QAbstractItemModel *)pQVar12);
    KDReports::AutoTableElement::setHorizontalHeaderVisible(SUB81(&local_60,0));
    KDReports::AutoTableElement::setVerticalHeaderVisible(SUB81(&local_60,0));
    pAVar9 = (AutoTableElement *)KDReports::Report::mainTable();
    KDReports::MainTable::setAutoTableElement(pAVar9);
    iVar8 = KDReports::Report::numberOfPages();
    cVar6 = QTest::qCompare(iVar8,2,"report.numberOfPages()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                            ,0x54);
    if (cVar6 != '\0') {
      KDReports::Report::mainTable();
      KDReports::MainTable::pageRects();
      cVar6 = QTest::qCompare(local_c8.size,2,"report.mainTable()->pageRects().count()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                              ,0x55);
      QArrayDataPointer<QRect>::~QArrayDataPointer(&local_c8);
      if (cVar6 != '\0') {
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_c8,0);
        iVar8 = pQVar10->y2 - pQVar10->y1;
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_c8);
        KDReports::Report::mainTable();
        KDReports::MainTable::pageRects();
        pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_c8,0);
        uVar13 = iVar8 + 1;
        local_98.d = (Data *)0x0;
        local_98.ptr = (char16_t *)CONCAT44(iVar8,1);
        bVar7 = QTest::qCompare<QRect,QRect>
                          (pQVar10,(QRect *)&local_98,"report.mainTable()->pageRects()[0]",
                           "QRect(0, 0, 2, rowsFirstPage)",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                           ,0x59);
        QArrayDataPointer<QRect>::~QArrayDataPointer(&local_c8);
        if (bVar7) {
          KDReports::Report::mainTable();
          KDReports::MainTable::pageRects();
          pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_c8,1);
          local_98.d = (Data *)0xffffffffffffffff;
          local_98.ptr = (char16_t *)0x0;
          local_98.size = 0;
          iVar8 = QStandardItemModel::rowCount((QModelIndex *)pQVar12);
          local_78.d = (Data *)((ulong)uVar13 << 0x20);
          local_78.ptr = (char16_t *)CONCAT44(iVar8 + -1,1);
          bVar7 = QTest::qCompare<QRect,QRect>
                            (pQVar10,(QRect *)&local_78,"report.mainTable()->pageRects()[1]",
                             "QRect(0, rowsFirstPage, 2, m_model.rowCount() - rowsFirstPage)",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                             ,0x5a);
          QArrayDataPointer<QRect>::~QArrayDataPointer(&local_c8);
          if (bVar7) {
            KDReports::AutoTableElement::setHorizontalHeaderVisible(SUB81(&local_60,0));
            pAVar9 = (AutoTableElement *)KDReports::Report::mainTable();
            KDReports::MainTable::setAutoTableElement(pAVar9);
            pQVar11 = (QFont *)KDReports::Report::mainTable();
            local_98.d = (Data *)0x0;
            local_98.ptr = (char16_t *)0x0;
            local_98.size = 0;
            QByteArrayView::QByteArrayView<char,_true>((QByteArrayView *)&local_78,"Noto Sans",9);
            QVar15.m_data = (storage_type *)local_78.d;
            QVar15.m_size = (qsizetype)&local_c8;
            QString::fromLatin1(QVar15);
            qVar3 = local_98.size;
            pcVar5 = local_98.ptr;
            pDVar4 = local_98.d;
            local_98.d = (Data *)local_c8.d;
            local_c8.d = (Data *)pDVar4;
            local_98.ptr = (char16_t *)local_c8.ptr;
            local_98.size = local_c8.size;
            local_c8.ptr = (QRect *)pcVar5;
            local_c8.size = qVar3;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_c8);
            QFont::QFont((QFont *)&local_40,(QString *)&local_98,0x30,-1,false);
            KDReports::MainTable::setHorizontalHeaderFont(pQVar11);
            QFont::~QFont((QFont *)&local_40);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
            iVar8 = KDReports::Report::numberOfPages();
            cVar6 = QTest::qCompare(iVar8,2,"report.numberOfPages()","2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                    ,0x60);
            if (cVar6 != '\0') {
              KDReports::Report::mainTable();
              KDReports::MainTable::pageRects();
              pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_c8,0);
              cVar6 = QTest::qVerify((pQVar10->y2 - pQVar10->y1) + 1 < (int)uVar13,
                                     "report.mainTable()->pageRects()[0].height() < rowsFirstPage",
                                     "",
                                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                     ,0x61);
              QArrayDataPointer<QRect>::~QArrayDataPointer(&local_c8);
              if (cVar6 != '\0') {
                KDReports::Report::setFontScalingFactor(0.2);
                iVar8 = KDReports::Report::numberOfPages();
                cVar6 = QTest::qCompare(iVar8,1,"report.numberOfPages()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                        ,0x65);
                if (cVar6 != '\0') {
                  KDReports::Report::mainTable();
                  local_c8.d = (Data *)KDReports::MainTable::lastAutoFontScalingFactor();
                  local_98.d = (Data *)0x3fc999999999999a;
                  cVar6 = QTest::qCompare((double *)&local_c8,(double *)&local_98,
                                          "report.mainTable()->lastAutoFontScalingFactor()","0.2",
                                          "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                                          ,0x66);
                  if (cVar6 != '\0') {
                    KDReports::Report::mainTable();
                    KDReports::MainTable::pageRects();
                    pQVar10 = QList<QRect>::operator[]((QList<QRect> *)&local_c8,0);
                    local_98.d = (Data *)0xffffffffffffffff;
                    local_98.ptr = (char16_t *)0x0;
                    local_98.size = 0;
                    iVar8 = QStandardItemModel::rowCount((QModelIndex *)pQVar12);
                    local_78.d = (Data *)0x0;
                    local_78.ptr = (char16_t *)CONCAT44(iVar8 + -1,1);
                    QTest::qCompare<QRect,QRect>
                              (pQVar10,(QRect *)&local_78,"report.mainTable()->pageRects()[0]",
                               "QRect(0, 0, 2, m_model.rowCount())",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                               ,0x67);
                    QArrayDataPointer<QRect>::~QArrayDataPointer(&local_c8);
                  }
                }
              }
            }
          }
        }
      }
    }
    KDReports::AutoTableElement::~AutoTableElement((AutoTableElement *)&local_60);
    KDReports::Report::~Report((Report *)&local_b0);
  }
  else {
    local_40.m_size = 0x10c8fb;
    QByteArrayView::QByteArrayView<const_char_*,_true>
              ((QByteArrayView *)&local_78,(char **)&local_40);
    QVar16.m_data = (storage_type *)local_78.d;
    QVar16.m_size = (qsizetype)&local_60;
    QString::fromUtf8(QVar16);
    local_98.d = local_60.d;
    local_98.ptr = local_60.ptr;
    local_60.d = (Data *)0x0;
    local_60.ptr = (char16_t *)0x0;
    local_98.size = local_60.size;
    local_60.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    local_30 = "Noto Sans";
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_40,&local_30);
    QVar17.m_data = (storage_type *)local_40.m_size;
    QVar17.m_size = (qsizetype)&local_60;
    QString::fromUtf8(QVar17);
    local_78.d = local_60.d;
    local_78.ptr = local_60.ptr;
    local_60.d = (Data *)0x0;
    local_60.ptr = (char16_t *)0x0;
    local_78.size = local_60.size;
    local_60.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QString::arg((QString *)&local_b0,(int)&local_98,(QChar)(char16_t)&local_78);
    QString::toLatin1_helper_inplace((QString *)&local_c8);
    if (local_c8.ptr == (QRect *)0x0) {
      local_c8.ptr = (QRect *)&QByteArray::_empty;
    }
    QTest::qSkip((char *)local_c8.ptr,
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/SpreadsheetMode/SpreadsheetMode.cpp"
                 ,0x4a);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_c8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  return;
}

Assistant:

void testFontScaling()
    {
        SKIP_IF_FONT_NOT_FOUND

        fillModel(2, 25);
        Report report;
        report.setReportMode(Report::SpreadSheet);
        report.setDefaultFont(QFont(QLatin1String(s_fontName), 24));
        AutoTableElement tableElement(&m_model);
        tableElement.setHorizontalHeaderVisible(false);
        tableElement.setVerticalHeaderVisible(false);
        report.mainTable()->setAutoTableElement(tableElement);
        QCOMPARE(report.numberOfPages(), 2);
        QCOMPARE(report.mainTable()->pageRects().count(), 2);

#ifndef Q_OS_MAC // Somehow the mac gets different font size for the headers, even compared to linux with DPI 72.
        const int rowsFirstPage = report.mainTable()->pageRects()[0].height();
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 2, rowsFirstPage));
        QCOMPARE(report.mainTable()->pageRects()[1], QRect(0, rowsFirstPage, 2, m_model.rowCount() - rowsFirstPage));

        // Now show a huge horizontal header, and check we have less rows per page
        tableElement.setHorizontalHeaderVisible(true);
        report.mainTable()->setAutoTableElement(tableElement);
        report.mainTable()->setHorizontalHeaderFont(QFont(QLatin1String(s_fontName), 48));
        QCOMPARE(report.numberOfPages(), 2);
        QVERIFY(report.mainTable()->pageRects()[0].height() < rowsFirstPage);

        // Now force a very small font scaling factor
        report.setFontScalingFactor(0.2);
        QCOMPARE(report.numberOfPages(), 1);
        QCOMPARE(report.mainTable()->lastAutoFontScalingFactor(), 0.2);
        QCOMPARE(report.mainTable()->pageRects()[0], QRect(0, 0, 2, m_model.rowCount()));
#endif
    }